

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

void * Curl_ssl_get_internals(Curl_easy *data,int sockindex,CURLINFO info,int n)

{
  ssl_connect_data *psVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  Curl_cfilter *pCVar4;
  
  if (data->conn != (connectdata *)0x0) {
    for (pCVar4 = data->conn->cfilter[sockindex]; pCVar4 != (Curl_cfilter *)0x0;
        pCVar4 = pCVar4->next) {
      if ((pCVar4->cft == &Curl_cft_ssl) || (pCVar4->cft == &Curl_cft_ssl_proxy)) goto LAB_00173587;
    }
    pCVar4 = (Curl_cfilter *)0x0;
LAB_00173587:
    if (pCVar4 != (Curl_cfilter *)0x0) {
      psVar1 = (ssl_connect_data *)pCVar4->ctx;
      pCVar2 = (psVar1->call_data).data;
      (psVar1->call_data).data = data;
      pvVar3 = (*Curl_ssl->get_internals)(psVar1,info);
      *(Curl_easy **)((long)pCVar4->ctx + 0x38) = pCVar2;
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

void *Curl_ssl_get_internals(struct Curl_easy *data, int sockindex,
                             CURLINFO info, int n)
{
  void *result = NULL;
  (void)n;
  if(data->conn) {
    struct Curl_cfilter *cf;
    /* get first SSL filter in chain, if any is present */
    cf = get_ssl_filter(data->conn->cfilter[sockindex]);
    if(cf) {
      struct cf_call_data save;
      CF_DATA_SAVE(save, cf, data);
      result = Curl_ssl->get_internals(cf->ctx, info);
      CF_DATA_RESTORE(cf, save);
    }
  }
  return result;
}